

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nes_apu.c
# Opt level: O2

void nes_apu_update(void *chip,UINT32 samples,DEV_SMPL **outputs)

{
  byte bVar1;
  ushort uVar2;
  uint uVar3;
  DEV_SMPL *pDVar4;
  DEV_SMPL *pDVar5;
  short sVar6;
  byte bVar7;
  uint uVar8;
  long lVar9;
  byte bVar10;
  byte bVar11;
  short sVar12;
  int iVar13;
  uint uVar14;
  char cVar15;
  ulong uVar16;
  sbyte sVar17;
  float fVar18;
  
  pDVar4 = *outputs;
  pDVar5 = outputs[1];
  uVar16 = 0;
  do {
    if (uVar16 == samples) {
      return;
    }
    apu_square((nesapu_state *)chip,(square_t *)((long)chip + 8));
    apu_square((nesapu_state *)chip,(square_t *)((long)chip + 0x30));
    if ((*(char *)((long)chip + 0x72) == '\x01') && (*(char *)((long)chip + 0x74) == '\0')) {
      bVar11 = *(byte *)((long)chip + 0x58);
      if (((char)bVar11 < '\0' || *(char *)((long)chip + 0x71) != '\0') ||
         ((*(int *)((long)chip + 0x68) != 0 &&
          (iVar13 = *(int *)((long)chip + 0x68) + -1, *(int *)((long)chip + 0x68) = iVar13,
          iVar13 != 0)))) {
        if (*(char *)((long)chip + 0x71) != '\0') goto LAB_0014ebe1;
        iVar13 = *(int *)((long)chip + 0x5c);
      }
      else {
        *(undefined1 *)((long)chip + 0x71) = 1;
LAB_0014ebe1:
        if (*(char *)((long)chip + 0x60) == '\x01') {
          iVar13 = *(int *)((long)chip + (ulong)(bVar11 & 0x7f) * 4 + 0x208);
LAB_0014ec01:
          *(int *)((long)chip + 0x5c) = iVar13;
        }
        else {
          iVar13 = *(int *)((long)chip + 0x5c);
          if (0 < iVar13) {
            iVar13 = iVar13 + -1;
            goto LAB_0014ec01;
          }
        }
        if (-1 < (char)bVar11) {
          *(undefined1 *)((long)chip + 0x60) = 0;
          if (*(int *)((long)chip + 100) != 0) {
            *(int *)((long)chip + 100) = *(int *)((long)chip + 100) + -1;
          }
        }
      }
      if (((iVar13 == 0) || (*(int *)((long)chip + 100) == 0)) ||
         (uVar8 = (uint)*(byte *)((long)chip + 0x5a) | (*(byte *)((long)chip + 0x5b) & 7) << 8,
         uVar8 < 3)) goto LAB_0014ec3b;
      fVar18 = *(float *)((long)chip + 0x6c) - *(float *)((long)chip + 0xfc);
      *(float *)((long)chip + 0x6c) = fVar18;
      while (fVar18 < 0.0) {
        fVar18 = fVar18 + (float)(uVar8 + 1);
        *(float *)((long)chip + 0x6c) = fVar18;
        bVar10 = *(char *)((long)chip + 0x70) + 1;
        *(byte *)((long)chip + 0x70) = bVar10 & 0x1f;
        bVar11 = bVar10 & 0xf ^ 7;
        if ((bVar10 & 8) == 0) {
          bVar11 = bVar10 & 0xf | 8;
        }
        bVar7 = bVar11 * '\x02' ^ 0x1e;
        if ((bVar10 & 0x10) == 0) {
          bVar7 = bVar11 * '\x02';
        }
        *(byte *)((long)chip + 0x73) = bVar7 - 0x10;
      }
    }
    else {
LAB_0014ec3b:
      *(undefined1 *)((long)chip + 0x73) = 0;
    }
    if ((*(char *)((long)chip + 0x95) == '\x01') && (*(char *)((long)chip + 0x97) == '\0')) {
      bVar11 = *(byte *)((long)chip + 0x80);
      uVar8 = bVar11 & 0xf;
      fVar18 = *(float *)((long)chip + 0x90) + -4.0;
      iVar13 = *(int *)((long)chip + (ulong)uVar8 * 4 + 0x188);
      *(float *)((long)chip + 0x90) = fVar18;
LAB_0014ec88:
      if (fVar18 < 0.0) {
        fVar18 = fVar18 + (float)iVar13;
        *(float *)((long)chip + 0x90) = fVar18;
        bVar10 = *(byte *)((long)chip + 0x94);
        if ((bVar11 & 0x20) == 0) break;
        bVar10 = bVar10 + 1 & 0xf;
        goto LAB_0014ecb2;
      }
      iVar13 = *(int *)((long)chip + 0x88);
      if (0 < iVar13 && (bVar11 & 0x20) == 0) {
        iVar13 = iVar13 + -1;
        *(int *)((long)chip + 0x88) = iVar13;
      }
      if (iVar13 == 0) goto LAB_0014ed79;
      fVar18 = *(float *)((long)chip + 0x8c) - *(float *)((long)chip + 0xfc);
      *(float *)((long)chip + 0x8c) = fVar18;
      iVar13 = noise_freq[*(byte *)((long)chip + 0xf8)][*(byte *)((long)chip + 0x82) & 0xf];
      while (fVar18 < 0.0) {
        fVar18 = fVar18 + (float)iVar13;
        *(float *)((long)chip + 0x8c) = fVar18;
        sVar17 = ((char)*(byte *)((long)chip + 0x82) < '\0') * '\x05' + 1;
        if (*(char *)((long)chip + 0xfa) != '\0') {
          sVar17 = 1;
        }
        uVar2 = *(ushort *)((long)chip + 0x84);
        *(short *)((long)chip + 0x84) =
             (short)((((ushort)(uVar2 >> sVar17 ^ uVar2) & 1) << 0xf | (uint)uVar2) >> 1);
      }
      if ((bVar11 & 0x10) == 0) {
        uVar8 = (uint)(byte)(0xf - *(char *)((long)chip + 0x94));
      }
      cVar15 = -(char)uVar8;
      if ((*(byte *)((long)chip + 0x84) & 1) != 0) {
        cVar15 = (char)uVar8;
      }
    }
    else {
LAB_0014ed79:
      cVar15 = '\0';
    }
    *(char *)((long)chip + 0x96) = cVar15;
    if (*(char *)((long)chip + 0xc3) == '\0') {
      if (*(char *)((long)chip + 0xb5) == '\x01') {
        fVar18 = *(float *)((long)chip + 0xb0) - *(float *)((long)chip + 0xfc);
        *(float *)((long)chip + 0xb0) = fVar18;
        iVar13 = dpcm_clocks[*(byte *)((long)chip + 0xf8)][*(byte *)((long)chip + 0xa0) & 0xf];
        while (fVar18 < 0.0) {
          *(float *)((long)chip + 0xb0) = fVar18 + (float)iVar13;
          if (*(int *)((long)chip + 0xa8) == 0) {
            *(undefined1 *)((long)chip + 0xb5) = 0;
            if ((*(byte *)((long)chip + 0xa0) & 0x40) == 0) {
              if ((char)*(byte *)((long)chip + 0xa0) < '\0') {
                *(undefined1 *)((long)chip + 0xb6) = 1;
              }
              break;
            }
            apu_dpcmreset((dpcm_t *)((long)chip + 0xa0));
          }
          uVar8 = *(int *)((long)chip + 0xac) - 1;
          *(uint *)((long)chip + 0xac) = uVar8;
          uVar8 = uVar8 & 7;
          if (uVar8 == 0) {
            uVar3 = *(uint *)((long)chip + 0xa4);
            bVar11 = *(byte *)(*(long *)((long)chip + 0xb8) + (ulong)uVar3);
            *(byte *)((long)chip + 0xb4) = bVar11;
            uVar14 = uVar3 - 0x7fff;
            if (uVar3 + 1 < 0x10000) {
              uVar14 = uVar3 + 1;
            }
            *(uint *)((long)chip + 0xa4) = uVar14;
            *(int *)((long)chip + 0xa8) = *(int *)((long)chip + 0xa8) + -1;
          }
          else {
            bVar11 = *(byte *)((long)chip + 0xb4);
          }
          sVar12 = 2;
          if (((bVar11 >> (uVar8 ^ 7) & 1) != 0) || (sVar12 = -2, 1 < *(short *)((long)chip + 0xc0))
             ) {
            *(short *)((long)chip + 0xc0) = sVar12 + *(short *)((long)chip + 0xc0);
          }
          fVar18 = *(float *)((long)chip + 0xb0);
        }
      }
      sVar12 = *(short *)((long)chip + 0xc0);
      sVar6 = 0x7f;
      if (sVar12 < 0x80) {
        if (-1 < sVar12) goto LAB_0014eefb;
        sVar6 = 0;
      }
      sVar12 = sVar6;
      *(short *)((long)chip + 0xc0) = sVar12;
    }
    else {
      sVar12 = 0;
    }
LAB_0014eefb:
    bVar7 = (byte)sVar12;
    *(byte *)((long)chip + 0xc2) = bVar7;
    bVar11 = *(byte *)((long)chip + 0x23);
    bVar10 = *(byte *)((long)chip + 0x96);
    if (*(char *)((long)chip + 0xf9) == '\0') {
      bVar1 = *(byte *)((long)chip + 0x4b);
      cVar15 = *(char *)((long)chip + 0x73);
      pDVar4[uVar16] = *(int *)((long)chip + 0x28) * (int)(short)((ushort)bVar11 << 8) >> 0x10;
      pDVar5[uVar16] = (int)(short)((ushort)bVar11 << 8) * *(int *)((long)chip + 0x2c) >> 0x10;
      iVar13 = (int)(short)((ushort)bVar1 << 8);
      pDVar4[uVar16] = pDVar4[uVar16] + (*(int *)((long)chip + 0x50) * iVar13 >> 0x10);
      pDVar5[uVar16] = pDVar5[uVar16] + (iVar13 * *(int *)((long)chip + 0x54) >> 0x10);
      iVar13 = cVar15 * 0xc00000 >> 0x10;
      pDVar4[uVar16] = pDVar4[uVar16] + (*(int *)((long)chip + 0x78) * iVar13 >> 0x10);
      pDVar5[uVar16] = pDVar5[uVar16] + (iVar13 * *(int *)((long)chip + 0x7c) >> 0x10);
      iVar13 = (char)bVar10 * 0xc00000 >> 0x10;
      pDVar4[uVar16] = pDVar4[uVar16] + (*(int *)((long)chip + 0x98) * iVar13 >> 0x10);
      pDVar5[uVar16] = pDVar5[uVar16] + (iVar13 * *(int *)((long)chip + 0x9c) >> 0x10);
      lVar9 = (ulong)bVar7 * 0xc0;
      pDVar4[uVar16] = pDVar4[uVar16] + (int)((ulong)(*(int *)((long)chip + 0xc4) * lVar9) >> 0x10);
      pDVar5[uVar16] = pDVar5[uVar16] + (int)((ulong)(*(int *)((long)chip + 200) * lVar9) >> 0x10);
    }
    else {
      if ((char)bVar11 < '\x01') {
        bVar11 = 0;
      }
      cVar15 = *(char *)((long)chip + 0x4b);
      if (cVar15 < '\x01') {
        cVar15 = '\0';
      }
      if ((char)bVar10 < '\x01') {
        bVar10 = 0;
      }
      iVar13 = tnd_lut[(short)(*(char *)((long)chip + 0x73) + 0x10) / 2][bVar10][bVar7] +
               square_lut[(byte)(cVar15 + bVar11)];
      pDVar4[uVar16] = iVar13;
      pDVar5[uVar16] = iVar13;
    }
    uVar16 = uVar16 + 1;
  } while( true );
  if (bVar10 < 0xf) {
    bVar10 = bVar10 + 1;
LAB_0014ecb2:
    *(byte *)((long)chip + 0x94) = bVar10;
  }
  goto LAB_0014ec88;
}

Assistant:

void nes_apu_update(void* chip, UINT32 samples, DEV_SMPL **outputs)
{
	nesapu_state *info = (nesapu_state*)chip;
	apu_t *apu = &info->APU;
	DEV_SMPL* bufL = outputs[0];
	DEV_SMPL* bufR = outputs[1];
	UINT32 i;

	for (i = 0; i < samples; i++)
	{
		INT16 squ1, squ2, tri, noi, dpcm;

		apu_square(info, &apu->squ[0]);
		apu_square(info, &apu->squ[1]);
		apu_triangle(info, &apu->tri);
		apu_noise(info, &apu->noi);
		apu_dpcm(info, &apu->dpcm);

		if (info->nonlinear_mixing)
		{
			squ1 = (apu->squ[0].output >= 0) ? apu->squ[0].output : 0;
			squ2 = (apu->squ[1].output >= 0) ? apu->squ[1].output : 0;
			tri  = (apu->tri.output + 0x10) / 2;
			noi  = (apu->noi.output >= 0) ? apu->noi.output : 0;
			dpcm = apu->dpcm.output;
			bufL[i] = square_lut[squ1 + squ2];
			bufL[i] += tnd_lut[tri][noi][dpcm];
			bufR[i] = bufL[i];
		}
		else
		{
			// These volumes should match NSFPlay's NES core better
			squ1 = apu->squ[0].output * 0x100;	// [-15..+15] << 8 * 1.0
			squ2 = apu->squ[1].output * 0x100;	// [-15..+15] << 8 * 1.0
			tri  = apu->tri.output * 0xC0;	// [-16..+16] << 8 * 0.75
			noi  = apu->noi.output * 0xC0;	// [-15..+15] << 8 * 0.75
			dpcm = apu->dpcm.output * 0xC0;	// [0..+127] << 8 * 0.75

			bufL[i]  = APPLY_PANNING_S(squ1, apu->squ[0].Pan[0]);
			bufR[i]  = APPLY_PANNING_S(squ1, apu->squ[0].Pan[1]);
			bufL[i] += APPLY_PANNING_S(squ2, apu->squ[1].Pan[0]);
			bufR[i] += APPLY_PANNING_S(squ2, apu->squ[1].Pan[1]);
			bufL[i] += APPLY_PANNING_S(tri, apu->tri.Pan[0]);
			bufR[i] += APPLY_PANNING_S(tri, apu->tri.Pan[1]);
			bufL[i] += APPLY_PANNING_S(noi, apu->noi.Pan[0]);
			bufR[i] += APPLY_PANNING_S(noi, apu->noi.Pan[1]);
			bufL[i] += APPLY_PANNING_L(dpcm, apu->dpcm.Pan[0]);	// could be 0..24384, thus use _L macro
			bufR[i] += APPLY_PANNING_L(dpcm, apu->dpcm.Pan[1]);
		}
	}
}